

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O2

int __thiscall
helics::ipc::SendToQueue::connect(SendToQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  string *this_00;
  bool bVar1;
  bool bVar2;
  void *__p;
  queue_state_t qVar3;
  int iVar4;
  undefined4 in_register_00000034;
  duration<long,_std::ratio<1L,_1000L>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined4 local_c0;
  string *local_b8;
  __single_object queue_state;
  mapped_region region;
  string stateName;
  string local_50;
  
  local_c0 = SUB84(__addr,0);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->connectionNameOrig,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,__fd));
  stringTranslateToCppName(&stateName,&local_50);
  this_00 = &this->connectionName;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateName);
  std::__cxx11::string::~string((string *)&stateName);
  std::__cxx11::string::~string((string *)&local_50);
  local_b8 = this_00;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 "_state");
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->errorString
  ;
  bVar2 = false;
  iVar4 = 0;
  do {
    if (bVar2) {
      while (this->connected == false) {
        queue_state._M_t.
        super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
        ._M_t.
        super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
        .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
             (__uniq_ptr_data<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>,_true,_true>
              )(local_b8->_M_dataplus)._M_p;
        std::
        make_unique<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>,boost::interprocess::open_only_t_const&,char_const*>
                  ((open_only_t *)&region,(char **)&boost::interprocess::open_only);
        __p = region.m_base;
        region.m_base = (void *)0x0;
        std::
        __uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
        ::reset((__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                 *)this,(pointer)__p);
        std::
        unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
        ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                       *)&region);
        this->connected = true;
      }
      iVar4 = 0x34c701;
      goto LAB_0022349f;
    }
    region.m_base = stateName._M_dataplus._M_p;
    local_d0.__r._0_4_ = 2;
    std::
    make_unique<boost::interprocess::shared_memory_object,boost::interprocess::open_only_t_const&,char_const*,boost::interprocess::mode_t>
              ((open_only_t *)&queue_state,(char **)&boost::interprocess::open_only,
               (mode_t *)&region);
    boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
              (&region,(shared_memory_object *)
                       queue_state._M_t.
                       super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                       .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                       _M_head_impl,read_write,0,0,(void *)0x0,-1);
    qVar3 = SharedQueueState::getState((SharedQueueState *)region.m_base);
    bVar1 = true;
    if ((uint)qVar3 < 2) {
      bVar2 = true;
    }
    else {
      if ((qVar3 == operating) && ((char)local_c0 == '\0')) {
        bVar2 = true;
      }
      if (!bVar2) {
        if (iVar4 < (int)__len) {
          std::
          __uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
          ::reset((__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                   *)&queue_state,(pointer)0x0);
          local_d0.__r = 200;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_d0);
          iVar4 = iVar4 + 1;
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          assign(local_c8,"timed out waiting for the queue to become available");
          bVar1 = false;
          iVar4 = iVar4 + 1;
        }
      }
    }
    boost::interprocess::mapped_region::~mapped_region(&region);
    std::
    unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
    ::~unique_ptr(&queue_state);
  } while (bVar1);
  iVar4 = 0;
LAB_0022349f:
  std::__cxx11::string::~string((string *)&stateName);
  return iVar4;
}

Assistant:

bool SendToQueue::connect(const std::string& connection, bool initOnly, int retries)
    {
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        std::string stateName = connectionName + "_state";
        bool goodToConnect = false;
        int tries = 0;
        while (!goodToConnect) {
            try {
                auto queue_state = std::make_unique<ipc_state>(boostipc::open_only,
                                                               stateName.c_str(),
                                                               boostipc::read_write);
                boostipc::mapped_region region(*queue_state, boostipc::read_write);

                auto* sstate = reinterpret_cast<SharedQueueState*>(region.get_address());

                switch (sstate->getState()) {
                    case queue_state_t::connected:
                    case queue_state_t::startup:
                        goodToConnect = true;
                        break;
                    case queue_state_t::operating:
                        if (!initOnly) {
                            goodToConnect = true;
                        }
                        break;
                    case queue_state_t::unknown:  // probably still undergoing setup
                    default:
                        break;
                }
                if (!goodToConnect) {
                    ++tries;
                    if (tries <= retries) {
                        queue_state.reset();
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    } else {
                        errorString = "timed out waiting for the queue to become available";
                        return false;
                    }
                }
            }

            catch (boost::interprocess::interprocess_exception const&) {
                // this likely means the shared_memory_object doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = "timed out waiting for the queue to become available";
                    return false;
                }
            }
        }

        while (!connected) {
            try {
                txqueue = std::make_unique<ipc_queue>(boostipc::open_only, connectionName.c_str());
                connected = true;
            }
            catch (boost::interprocess::interprocess_exception const& ipe) {
                // this likely means the shared file doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = std::string("Unable to open connection:") + ipe.what();
                    break;
                }
            }
        }
        return connected;
    }